

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O1

int __thiscall OpenMD::HBondJumpR::registerHydrogen(HBondJumpR *this,int frame,int hIndex)

{
  pointer pvVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  iterator iVar6;
  vector<int,std::allocator<int>> *pvVar7;
  long lVar8;
  int local_24 [3];
  
  lVar3 = *(long *)&(this->super_HBondJump).GIDtoH_.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[frame].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data;
  iVar5 = *(int *)(lVar3 + (long)hIndex * 4);
  if (iVar5 != -1) {
    return iVar5;
  }
  pvVar1 = (this->super_HBondJump).hydrogen_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)*(pointer *)
                               ((long)&pvVar1[frame].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data + 8) -
                       *(long *)&pvVar1[frame].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data) >> 2);
  *(int *)(lVar3 + (long)hIndex * 4) = iVar5;
  pvVar7 = (vector<int,std::allocator<int>> *)(pvVar1 + frame);
  iVar6._M_current = *(int **)(pvVar7 + 8);
  local_24[0] = frame;
  local_24[2] = hIndex;
  if (iVar6._M_current == *(int **)(pvVar7 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar7,iVar6,local_24 + 2);
  }
  else {
    *iVar6._M_current = hIndex;
    *(int **)(pvVar7 + 8) = iVar6._M_current + 1;
  }
  pvVar2 = (this->super_HBondJump).acceptor_.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + local_24[0];
  local_24[1] = 0xffffffff;
  iVar6._M_current =
       (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar6._M_current ==
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar6,local_24 + 1);
  }
  else {
    *iVar6._M_current = -1;
    (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((this->super_HBondJump).selected_.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_24[0],false);
  pvVar2 = (this->rbin_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + local_24[0];
  local_24[1] = 0xffffffff;
  iVar6._M_current =
       (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar6._M_current ==
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar6,local_24 + 1);
  }
  else {
    *iVar6._M_current = -1;
    (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar6._M_current + 1;
  }
  lVar3 = (long)local_24[0];
  if (lVar3 == 0) {
    pvVar2 = (this->super_HBondJump).lastAcceptor_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_24[1] = 0xffffffff;
    iVar6._M_current =
         (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar6._M_current ==
        (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar2,iVar6,local_24 + 1);
    }
    else {
      *iVar6._M_current = -1;
      (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar6._M_current + 1;
    }
    pvVar7 = (vector<int,std::allocator<int>> *)
             ((this->super_HBondJump).acceptorStartFrame_.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_24[0]);
    iVar6._M_current = *(int **)(pvVar7 + 8);
    if (iVar6._M_current == *(int **)(pvVar7 + 0x10)) {
      piVar4 = local_24;
      goto LAB_0013bc45;
    }
    *iVar6._M_current = local_24[0];
  }
  else {
    pvVar1 = (this->super_HBondJump).lastAcceptor_.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)*(int *)(*(long *)&(this->super_HBondJump).GIDtoH_.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar3 + -1].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data + (long)local_24[2] * 4) * 4;
    piVar4 = (int *)(*(long *)&pvVar1[lVar3 + -1].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data + lVar8);
    iVar6._M_current =
         *(pointer *)
          ((long)&pvVar1[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data + 8);
    if (iVar6._M_current ==
        *(pointer *)
         ((long)&pvVar1[lVar3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)(pvVar1 + lVar3),iVar6,piVar4);
    }
    else {
      *iVar6._M_current = *piVar4;
      *(int **)((vector<int,std::allocator<int>> *)(pvVar1 + lVar3) + 8) = iVar6._M_current + 1;
    }
    pvVar7 = (vector<int,std::allocator<int>> *)
             ((this->super_HBondJump).acceptorStartFrame_.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_24[0]);
    piVar4 = (int *)(lVar8 + *(long *)(pvVar7 + -0x18));
    iVar6._M_current = *(int **)(pvVar7 + 8);
    if (iVar6._M_current == *(int **)(pvVar7 + 0x10)) {
LAB_0013bc45:
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar7,iVar6,piVar4);
      return iVar5;
    }
    *iVar6._M_current = *piVar4;
  }
  *(int **)(pvVar7 + 8) = iVar6._M_current + 1;
  return iVar5;
}

Assistant:

int HBondJumpR::registerHydrogen(int frame, int hIndex) {
    int index;

    // If this hydrogen wasn't already registered, register it:
    if (GIDtoH_[frame][hIndex] == -1) {
      index = hydrogen_[frame].size();

      GIDtoH_[frame][hIndex] = index;
      hydrogen_[frame].push_back(hIndex);
      acceptor_[frame].push_back(-1);
      selected_[frame].push_back(false);
      rbin_[frame].push_back(-1);

      if (frame == 0) {
        lastAcceptor_[frame].push_back(-1);
        acceptorStartFrame_[frame].push_back(frame);
      } else {
        // Copy the last acceptor.
        int prevIndex = GIDtoH_[frame - 1][hIndex];
        lastAcceptor_[frame].push_back(lastAcceptor_[frame - 1][prevIndex]);
        acceptorStartFrame_[frame].push_back(
            acceptorStartFrame_[frame - 1][prevIndex]);
      }
    } else {
      // This hydrogen was already registered.  Just return the index:
      index = GIDtoH_[frame][hIndex];
    }
    return index;
  }